

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestNotifiesReporterOfTestFailureWithCorrectInfo::RunImpl
          (TestNotifiesReporterOfTestFailureWithCorrectInfo *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_9d0 [2];
  TestDetails local_990 [2];
  TestDetails local_950 [2];
  TestDetails local_910;
  int local_8ec [9];
  TestDetails local_8c8 [2];
  TestDetails local_888;
  int local_868 [4];
  undefined1 local_858 [8];
  TestResults results;
  RecordingReporter reporter;
  TestNotifiesReporterOfTestFailureWithCorrectInfo *this_local;
  
  reporter._2088_8_ = this;
  RecordingReporter::RecordingReporter((RecordingReporter *)&results.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_858,(TestReporter *)&results.m_failureCount);
  UnitTest::TestResults::OnTestFailure
            ((TestResults *)local_858,(TestDetails *)(anonymous_namespace)::details,"failurestring")
  ;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_868[0] = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_888,*ppTVar3,0x4b);
  UnitTest::CheckEqual<int,int>
            (pTVar1,local_868,(int *)(reporter.lastStartedTest + 0xf8),&local_888);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_8c8,*ppTVar3,0x4c);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastStartedTest + 0xfc,local_8c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8ec[0] = 0x7b;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_910,*ppTVar3,0x4d);
  UnitTest::CheckEqual<int,int>(pTVar1,local_8ec,(int *)(reporter.lastFailedFile + 0xf8),&local_910)
  ;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_950,*ppTVar3,0x4e);
  UnitTest::CheckEqual(pTVar1,"suitename",reporter.lastFailedFile + 0xfc,local_950);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_990,*ppTVar3,0x4f);
  UnitTest::CheckEqual(pTVar1,"testname",reporter.lastFailedSuite + 0xf8,local_990);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9d0,*ppTVar3,0x50);
  UnitTest::CheckEqual(pTVar1,"failurestring",reporter.lastFailedTest + 0xf8,local_9d0);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&results.m_failureCount);
  return;
}

Assistant:

TEST(NotifiesReporterOfTestFailureWithCorrectInfo)
{
    RecordingReporter reporter;
    TestResults results(&reporter);

    results.OnTestFailure(details, "failurestring");
    CHECK_EQUAL (1, reporter.testFailedCount);
    CHECK_EQUAL ("filename", reporter.lastFailedFile);
    CHECK_EQUAL (123, reporter.lastFailedLine);
    CHECK_EQUAL ("suitename", reporter.lastFailedSuite);
    CHECK_EQUAL ("testname", reporter.lastFailedTest);
    CHECK_EQUAL ("failurestring", reporter.lastFailedMessage);
}